

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_spacing.c
# Opt level: O1

unsigned_short XUtf8IsNonSpacing(uint ucs)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  ulong uVar3;
  
  if (ucs < 0x362) {
    if (ucs < 0x300) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0x300);
    puVar2 = ucs_table_0300;
  }
  else if (ucs < 0x487) {
    if (ucs < 0x483) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0x483);
    puVar2 = ucs_table_0483;
  }
  else if (ucs < 0x5c5) {
    if (ucs < 0x591) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0x591);
    puVar2 = ucs_table_0591;
  }
  else if (ucs < 0x6ee) {
    if (ucs < 0x64b) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0x64b);
    puVar2 = ucs_table_064B;
  }
  else if (ucs < 0xd4e) {
    if (ucs < 0x901) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0x901);
    puVar2 = ucs_table_0901;
  }
  else if (ucs < 0xfba) {
    if (ucs < 0xe31) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0xe31);
    puVar2 = ucs_table_0E31;
  }
  else if (ucs < 0x20e2) {
    if (ucs < 0x20d0) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0x20d0);
    puVar2 = ucs_table_20D0;
  }
  else if (ucs < 0x309b) {
    if (ucs < 0x302a) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0x302a);
    puVar2 = ucs_table_302A;
  }
  else {
    if (ucs < 0xfb1f) {
      uVar1 = 0;
      if (ucs == 0xfb1e) {
        uVar1 = 0xfb1e;
      }
      return uVar1;
    }
    if ((ucs & 0xfffffffc) != 0xfe20) {
      return 0;
    }
    uVar3 = (ulong)(ucs - 0xfe20);
    puVar2 = ucs_table_FE20;
  }
  return puVar2[uVar3];
}

Assistant:

unsigned short 
XUtf8IsNonSpacing(unsigned int ucs) {

  if (ucs <= 0x0361) {
    if (ucs >= 0x0300) return ucs_table_0300[ucs - 0x0300];
    return 0;
  }

  if (ucs <= 0x0486) {
    if (ucs >= 0x0483) return ucs_table_0483[ucs - 0x0483];
    return 0;
  }

  if (ucs <= 0x05C4) {
    if (ucs >= 0x0591) return ucs_table_0591[ucs - 0x0591];
    return 0;
  }

  if (ucs <= 0x06ED) {
    if (ucs >= 0x064B) return ucs_table_064B[ucs - 0x064B];
    return 0;
  }

  if (ucs <= 0x0D4D) {
    if (ucs >= 0x0901) return ucs_table_0901[ucs - 0x0901];
    return 0;
  }

  if (ucs <= 0x0FB9) {
    if (ucs >= 0x0E31) return ucs_table_0E31[ucs - 0x0E31];
    return 0;
  }

  if (ucs <= 0x20E1) {
    if (ucs >= 0x20D0) return ucs_table_20D0[ucs - 0x20D0];
    return 0;
  }

  if (ucs <= 0x309A) {
    if (ucs >= 0x302A) return ucs_table_302A[ucs - 0x302A];
    return 0;
  }

  if (ucs <= 0xFB1E) {
    if (ucs >= 0xFB1E) return ucs_table_FB1E[ucs - 0xFB1E];
    return 0;
  }

  if (ucs <= 0xFE23) {
    if (ucs >= 0xFE20) return ucs_table_FE20[ucs - 0xFE20];
    return 0;
  }

  return 0;
}